

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O3

void __thiscall BigInteger::_divide(BigInteger *this,int a,int *remainder)

{
  pointer puVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  zero_division_error *this_00;
  long lVar6;
  ulong uVar7;
  pointer puVar8;
  
  uVar7 = (ulong)(uint)a;
  if (a == 0) {
    this_00 = (zero_division_error *)__cxa_allocate_exception(0x10);
    zero_division_error::runtime_error(this_00,"Integer division by zero");
    __cxa_throw(this_00,&zero_division_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    *remainder = 0;
  }
  else {
    if (a < 0) {
      this->negative = (bool)(this->negative ^ 1);
      uVar7 = (ulong)(uint)-a;
    }
    lVar6 = 0;
    puVar8 = puVar2;
    do {
      uVar5 = (ulong)puVar8[-1] + lVar6 * 1000000000;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar7;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar5;
      lVar6 = SUB168(auVar4 % auVar3,0);
      puVar8[-1] = (uint)(uVar5 / uVar7);
      puVar8 = puVar8 + -1;
    } while (puVar8 != puVar1);
    *remainder = SUB164(auVar4 % auVar3,0);
    do {
      puVar8 = puVar2 + -1;
      if (*puVar8 != 0) {
        if (puVar2 != puVar1) {
          return;
        }
        break;
      }
      (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar8;
      puVar2 = puVar8;
    } while (puVar8 != puVar1);
    this->negative = false;
  }
  return;
}

Assistant:

void BigInteger::_divide(int a, int &remainder)
{
    if(!a)
        throw zero_division_error("Integer division by zero");
    if(digits.empty())
    {
        remainder = 0;
        return;
    }
    if(a < 0)
    {
        negative ^= 1;
        a = -a;
    }
    long long carry = 0;
    for(auto i = digits.rbegin(); i != digits.rend(); ++i)
    {
        carry = carry * BLOCK_MOD + *i;
        *i = carry / a;
        carry %= a;
    }
    remainder = static_cast<int>(carry);
    normalize();
}